

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

Status __thiscall
leveldb::BlockConstructor::FinishImpl(BlockConstructor *this,Options *options,KVMap *data)

{
  BlockConstructor *pBVar1;
  _Rb_tree_node_base *p_Var2;
  Block *pBVar3;
  long in_RCX;
  Slice SVar4;
  BlockBuilder builder;
  BlockContents local_d0;
  BlockConstructor *local_b0;
  Slice local_a8;
  BlockBuilder local_98;
  
  pBVar3 = (Block *)options[1].comparator;
  local_b0 = this;
  if (pBVar3 != (Block *)0x0) {
    Block::~Block(pBVar3);
  }
  operator_delete(pBVar3);
  options[1].comparator = (Comparator *)0x0;
  BlockBuilder::BlockBuilder(&local_98,(Options *)data);
  p_Var2 = *(_Rb_tree_node_base **)(in_RCX + 0x18);
  if (p_Var2 != (_Rb_tree_node_base *)(in_RCX + 8)) {
    do {
      local_d0.data.data_ = *(char **)(p_Var2 + 1);
      local_d0.data.size_ = (size_t)p_Var2[1]._M_parent;
      local_a8.data_ = *(char **)(p_Var2 + 2);
      local_a8.size_ = (size_t)p_Var2[2]._M_parent;
      BlockBuilder::Add(&local_98,&local_d0.data,&local_a8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)(in_RCX + 8));
  }
  SVar4 = BlockBuilder::Finish(&local_98);
  local_d0.data.data_ = &local_d0.cachable;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,SVar4.data_,SVar4.data_ + SVar4.size_);
  std::__cxx11::string::operator=((string *)&options->block_restart_interval,(string *)&local_d0);
  if ((bool *)local_d0.data.data_ != &local_d0.cachable) {
    operator_delete(local_d0.data.data_);
  }
  local_d0.data.data_ = *(char **)&options->block_restart_interval;
  local_d0.data.size_ = options->max_file_size;
  local_d0.cachable = false;
  local_d0.heap_allocated = false;
  pBVar3 = (Block *)operator_new(0x18);
  Block::Block(pBVar3,&local_d0);
  pBVar1 = local_b0;
  options[1].comparator = (Comparator *)pBVar3;
  (local_b0->super_Constructor)._vptr_Constructor = (_func_int **)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.last_key_._M_dataplus._M_p != &local_98.last_key_.field_2) {
    operator_delete(local_98.last_key_._M_dataplus._M_p);
  }
  if (local_98.restarts_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.restarts_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.buffer_._M_dataplus._M_p != &local_98.buffer_.field_2) {
    operator_delete(local_98.buffer_._M_dataplus._M_p);
  }
  return (Status)(char *)pBVar1;
}

Assistant:

Status FinishImpl(const Options& options, const KVMap& data) override {
    delete block_;
    block_ = nullptr;
    BlockBuilder builder(&options);

    for (const auto& kvp : data) {
      builder.Add(kvp.first, kvp.second);
    }
    // Open the block
    data_ = builder.Finish().ToString();
    BlockContents contents;
    contents.data = data_;
    contents.cachable = false;
    contents.heap_allocated = false;
    block_ = new Block(contents);
    return Status::OK();
  }